

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O3

Vec_Wrd_t * Vec_WrdReadHex(char *pFileName,int *pnWords,int fVerbose)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  Vec_Wrd_t *pVVar4;
  word *__ptr;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong local_50;
  ulong local_48;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pVVar4 = (Vec_Wrd_t *)0x0;
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
  }
  else {
    pVVar4 = (Vec_Wrd_t *)malloc(0x10);
    pVVar4->nCap = 1000;
    pVVar4->nSize = 0;
    __ptr = (word *)malloc(8000);
    pVVar4->pArray = __ptr;
    uVar2 = fgetc(__stream);
    uVar9 = 0xffffffff;
    uVar7 = 0;
    uVar8 = 0xffffffff;
    if (uVar2 != 0xffffffff) {
      local_48 = 1000;
      local_50 = 0;
      iVar3 = 0;
      do {
        while (((uVar2 == 10 && (uVar8 = uVar7, uVar9 == 0xffffffff)) ||
               ((uVar8 = uVar9, uVar2 < 0x21 && ((0x100002600U >> ((ulong)uVar2 & 0x3f) & 1) != 0)))
               )) {
          uVar2 = fgetc(__stream);
          uVar9 = uVar8;
          if (uVar2 == 0xffffffff) goto LAB_002953d7;
        }
        cVar1 = (char)uVar2;
        iVar6 = -0x30;
        if (((9 < (byte)(cVar1 - 0x30U)) && (iVar6 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
           (iVar6 = -0x57, 5 < (byte)(cVar1 + 0x9fU))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x506,"int Vec_WrdReadHexOne(char)");
        }
        local_50 = (ulong)((uVar2 & 0xff) + iVar6) << ((char)iVar3 * '\x04' & 0x3fU) | local_50;
        if (iVar3 < 0xf) {
          iVar3 = iVar3 + 1;
        }
        else {
          uVar2 = (uint)local_48;
          if (uVar7 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (__ptr == (word *)0x0) {
                __ptr = (word *)malloc(0x80);
              }
              else {
                __ptr = (word *)realloc(__ptr,0x80);
              }
              pVVar4->pArray = __ptr;
              local_48 = 0x10;
            }
            else {
              local_48 = (ulong)(uVar2 * 2);
              if (__ptr == (word *)0x0) {
                __ptr = (word *)malloc(local_48 * 8);
              }
              else {
                __ptr = (word *)realloc(__ptr,local_48 * 8);
              }
              pVVar4->pArray = __ptr;
            }
            if (__ptr == (word *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
            }
            pVVar4->nCap = (int)local_48;
          }
          lVar5 = (long)(int)uVar7;
          uVar7 = uVar7 + 1;
          pVVar4->nSize = uVar7;
          __ptr[lVar5] = local_50;
          iVar3 = 0;
          local_50 = 0;
        }
        uVar2 = fgetc(__stream);
      } while (uVar2 != 0xffffffff);
    }
LAB_002953d7:
    if ((int)uVar7 % (int)uVar8 != 0) {
      __assert_fail("Vec_WrdSize(p) % nWords == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x522,"Vec_Wrd_t *Vec_WrdReadHex(char *, int *, int)");
    }
    fclose(__stream);
    printf("Read %d words of simulation data for %d objects.\n",(ulong)uVar8,
           (long)(int)uVar7 / (long)(int)uVar8 & 0xffffffff);
  }
  return pVVar4;
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdReadHex( char * pFileName, int * pnWords, int fVerbose )
{
    Vec_Wrd_t * p = NULL; 
    int c, nWords = -1, nChars = 0; word Num = 0;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    p = Vec_WrdAlloc( 1000 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '\n' && nWords == -1 )
            nWords = Vec_WrdSize(p);
        if ( c == '\n' || c == '\r' || c == '\t' || c == ' ' )
            continue;
        Num |= (word)Vec_WrdReadHexOne((char)c) << (nChars * 4);
        if ( ++nChars < 16 )
            continue;
        Vec_WrdPush( p, Num );
        nChars = 0; 
        Num = 0;
    }
    assert( Vec_WrdSize(p) % nWords == 0 );
    fclose( pFile );
    if ( pnWords )
        *pnWords = nWords;
    if ( fVerbose )
        printf( "Read %d words of simulation data for %d objects.\n", nWords, Vec_WrdSize(p)/nWords );
    return p;
}